

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O2

CURLcode glob_url(URLGlob **glob,char *url,unsigned_long *urlnum,FILE *error)

{
  char cVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  FILE *pFVar9;
  bool bVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  size_t sVar15;
  char *pcVar16;
  URLGlob *glob_00;
  char **ppcVar17;
  char *__dest;
  int *piVar18;
  anon_union_40_3_e2f18bb4_for_content *paVar19;
  undefined1 *puVar20;
  ulong uVar21;
  byte *pbVar22;
  byte *pbVar23;
  byte *pbVar24;
  URLPattern *pUVar25;
  size_t sVar26;
  long lVar27;
  size_t sVar28;
  CURLcode CVar29;
  ulong uVar30;
  anon_union_40_3_e2f18bb4_for_content *paVar31;
  bool bVar32;
  ulong local_2b0;
  byte *local_2a8;
  char end_c;
  char max_c;
  char min_c;
  anon_union_40_3_e2f18bb4_for_content *local_298;
  byte *local_290;
  int local_284;
  byte *local_280;
  byte *local_278;
  long local_270;
  FILE *local_268;
  unsigned_long *local_260;
  byte *local_258;
  byte *local_250;
  URLPattern *local_248;
  URLGlob **local_240;
  char *endp;
  
  *glob = (URLGlob *)0x0;
  local_268 = error;
  local_260 = urlnum;
  local_258 = (byte *)url;
  sVar15 = strlen(url);
  pcVar16 = (char *)malloc(sVar15 + 1);
  CVar29 = CURLE_OUT_OF_MEMORY;
  if (pcVar16 != (char *)0x0) {
    *pcVar16 = '\0';
    local_2a8 = (byte *)0x1;
    glob_00 = (URLGlob *)calloc(1,0x12f0);
    if (glob_00 == (URLGlob *)0x0) {
      free(pcVar16);
    }
    else {
      glob_00->urllen = sVar15;
      glob_00->glob_buffer = pcVar16;
      local_2b0 = 1;
      CVar29 = CURLE_OK;
      local_284 = 0;
      pbVar22 = local_258;
      local_240 = glob;
      do {
        if ((CVar29 != CURLE_OK) || (*pbVar22 == 0)) {
          if (CVar29 == CURLE_OK) {
            *local_260 = local_2b0;
            *local_240 = glob_00;
            return CURLE_OK;
          }
          goto LAB_0011c528;
        }
        pbVar24 = (byte *)glob_00->glob_buffer;
        sVar15 = 0;
LAB_0011bc23:
        for (; bVar11 = *pbVar22, bVar11 == 0x5b; pbVar22 = pbVar22 + sVar26) {
          uVar30 = 0;
          sVar26 = 1;
          while( true ) {
            do {
              do {
                sVar28 = sVar26 + 1;
                bVar11 = pbVar22[sVar26];
                uVar14 = (uint)bVar11;
                iVar12 = Curl_isalnum(uVar14);
                sVar26 = sVar28;
              } while (iVar12 != 0);
            } while ((bVar11 == 0x25) || (uVar14 == 0x2e));
            if (uVar14 != 0x3a) break;
            uVar30 = uVar30 + 1;
          }
          if (uVar14 == 0x5d) {
            if (uVar30 < 2) goto LAB_0011bc6f;
LAB_0011bc79:
            sVar26 = sVar28;
            if (sVar26 == 0) goto LAB_0011bd09;
          }
          else {
            sVar28 = 0;
LAB_0011bc6f:
            sVar26 = 2;
            if (pbVar22[1] != 0x5d) goto LAB_0011bc79;
          }
          memcpy(pbVar24,pbVar22,sVar26);
          pbVar24 = pbVar24 + sVar26;
          sVar15 = sVar15 + sVar26;
        }
        if (bVar11 != 0) {
          if (bVar11 != 0x5c) {
            if (bVar11 != 0x5d) {
              if (bVar11 == 0x7b) goto LAB_0011bd09;
              if (bVar11 != 0x7d) goto LAB_0011bcf0;
            }
            pcVar16 = "unmatched close brace/bracket";
            goto LAB_0011c50c;
          }
          pbVar23 = pbVar22 + 1;
          uVar14 = *pbVar23 - 0x5b;
          bVar11 = 0x5c;
          if ((uVar14 < 0x23) && ((0x500000005U >> ((ulong)uVar14 & 0x3f) & 1) != 0)) {
            pbVar22 = pbVar22 + 1;
            local_2a8 = local_2a8 + 1;
            bVar11 = *pbVar23;
          }
LAB_0011bcf0:
          pbVar22 = pbVar22 + 1;
          *pbVar24 = bVar11;
          pbVar24 = pbVar24 + 1;
          local_2a8 = local_2a8 + 1;
          sVar15 = sVar15 + 1;
          goto LAB_0011bc23;
        }
LAB_0011bd09:
        if (sVar15 == 0) {
          CVar29 = CURLE_OK;
          if (*pbVar22 == 0x5b) {
            pbVar24 = pbVar22 + 1;
            local_2a8 = local_2a8 + 1;
            pUVar25 = glob_00->pattern + glob_00->size;
            glob_00->pattern[glob_00->size].globindex = local_284;
            local_284 = local_284 + 1;
            iVar12 = Curl_isalpha((uint)pbVar22[1]);
            pbVar23 = pbVar24;
            if (iVar12 == 0) {
              iVar12 = Curl_isdigit((uint)*pbVar24);
              if (iVar12 != 0) {
                pUVar25->type = UPTNumRange;
                (pUVar25->content).NumRange.padlength = 0;
                if (*pbVar24 == 0x30) {
                  pbVar22 = pbVar22 + 2;
                  bVar11 = 0x30;
                  while (iVar12 = Curl_isdigit((uint)bVar11), iVar12 != 0) {
                    piVar18 = &(pUVar25->content).NumRange.padlength;
                    *piVar18 = *piVar18 + 1;
                    bVar11 = *pbVar22;
                    pbVar22 = pbVar22 + 1;
                  }
                }
                piVar18 = __errno_location();
                *piVar18 = 0;
                paVar19 = (anon_union_40_3_e2f18bb4_for_content *)strtoul((char *)pbVar24,&endp,10);
                if (((*piVar18 == 0) && ((byte *)endp != pbVar24)) &&
                   (pbVar23 = (byte *)endp, *endp == '-')) {
                  do {
                    do {
                      pbVar23 = pbVar23 + 1;
                      bVar11 = *pbVar23;
                    } while (bVar11 == 0x20);
                  } while (bVar11 == 9);
                  local_298 = paVar19;
                  iVar12 = Curl_isdigit((uint)bVar11);
                  if (iVar12 == 0) {
                    puVar20 = (undefined1 *)0x0;
LAB_0011c47f:
                    uVar30 = 0;
                  }
                  else {
                    *piVar18 = 0;
                    puVar20 = (undefined1 *)strtoul((char *)pbVar23,&endp,10);
                    if (*piVar18 != 0) goto LAB_0011c47f;
                    cVar1 = *endp;
                    if (cVar1 != ':') {
                      uVar30 = 1;
LAB_0011c4c6:
                      paVar19 = local_298;
                      if (cVar1 == ']') {
                        pbVar23 = (byte *)(endp + 1);
                        bVar32 = true;
                      }
                      else {
                        bVar32 = false;
                      }
                      goto LAB_0011c159;
                    }
                    pbVar23 = (byte *)(endp + 1);
                    *piVar18 = 0;
                    uVar30 = strtoul((char *)pbVar23,&endp,10);
                    if ((*piVar18 == 0) && (endp != (char *)0x0)) {
                      cVar1 = *endp;
                      goto LAB_0011c4c6;
                    }
                  }
                  bVar32 = false;
                  paVar19 = local_298;
                }
                else {
                  bVar32 = false;
                  puVar20 = (undefined1 *)0x0;
                  uVar30 = 0;
                  pbVar23 = pbVar24;
                }
LAB_0011c159:
                local_2a8 = pbVar23 + ((long)local_2a8 - (long)pbVar24);
                pcVar16 = "bad range";
                if (((bVar32) && (pcVar16 = "bad range", uVar30 != 0)) &&
                   ((paVar19 != (anon_union_40_3_e2f18bb4_for_content *)puVar20 ||
                    (pcVar16 = "bad range", uVar30 == 1)))) {
                  uVar21 = (long)puVar20 - (long)paVar19;
                  if (uVar21 == 0) {
                    uVar21 = 0;
                  }
                  else {
                    pcVar16 = "bad range";
                    if ((puVar20 < paVar19) || (pcVar16 = "bad range", uVar21 < uVar30))
                    goto LAB_0011c195;
                  }
                  (pUVar25->content).NumRange.min_n = (unsigned_long)paVar19;
                  (pUVar25->content).NumRange.ptr_n = (unsigned_long)paVar19;
                  (pUVar25->content).NumRange.max_n = (unsigned_long)puVar20;
                  (pUVar25->content).NumRange.step = uVar30;
                  uVar21 = uVar21 / uVar30 + 1;
                  uVar30 = 0;
                  if (uVar21 != 0) {
                    auVar5._8_8_ = 0;
                    auVar5._0_8_ = uVar21;
                    auVar8._8_8_ = 0;
                    auVar8._0_8_ = local_2b0;
                    pcVar16 = "range overflow";
                    uVar30 = SUB168(auVar5 * auVar8,0);
                    if (SUB168(auVar5 * auVar8,8) != 0) goto LAB_0011c195;
                  }
                  goto LAB_0011c46a;
                }
LAB_0011c195:
                glob_00->error = pcVar16;
                goto LAB_0011c245;
              }
              glob_00->error = "bad range specification";
              glob_00->pos = (size_t)local_2a8;
            }
            else {
              pUVar25->type = UPTCharRange;
              iVar12 = __isoc99_sscanf(pbVar24,"%c-%c%c",&min_c,&max_c,&end_c);
              bVar32 = true;
              bVar10 = true;
              if (iVar12 == 3) {
                if (end_c == ']') {
                  pbVar23 = pbVar22 + 5;
                  bVar10 = false;
                  goto LAB_0011c1f0;
                }
                uVar30 = 1;
                if (end_c == ':') {
                  piVar18 = __errno_location();
                  *piVar18 = 0;
                  uVar30 = strtoul((char *)(pbVar22 + 5),&endp,10);
                  if ((*piVar18 == 0) && (pbVar22 + 5 != (byte *)endp)) {
                    pbVar23 = (byte *)(endp + 1);
                    if (*endp != ']') {
                      uVar30 = 0;
                      pbVar23 = pbVar24;
                    }
                  }
                  else {
                    uVar30 = 0;
                  }
                  bVar32 = false;
                }
              }
              else {
LAB_0011c1f0:
                bVar32 = bVar10;
                uVar30 = 1;
              }
              local_2a8 = pbVar23 + ((long)local_2a8 - (long)pbVar24);
              pcVar16 = "bad range";
              if (((!bVar32) && (pcVar16 = "bad range", 0xffffffff80000000 < uVar30 - 0x80000000))
                 && ((min_c != max_c || (pcVar16 = "bad range", uVar30 == 1)))) {
                if (min_c == max_c) {
                  uVar14 = (int)max_c - (int)min_c;
LAB_0011c269:
                  (pUVar25->content).CharRange.step = (int)uVar30;
                  (pUVar25->content).CharRange.min_c = min_c;
                  (pUVar25->content).CharRange.ptr_c = min_c;
                  (pUVar25->content).CharRange.max_c = max_c;
                  iVar12 = (int)uVar14 / (int)uVar30 + 1;
                  if (iVar12 == 0) {
                    local_2b0 = 0;
                    uVar30 = local_2b0;
                  }
                  else {
                    auVar4._8_8_ = 0;
                    auVar4._0_8_ = (long)iVar12;
                    auVar7._8_8_ = 0;
                    auVar7._0_8_ = local_2b0;
                    pcVar16 = "range overflow";
                    uVar30 = SUB168(auVar4 * auVar7,0);
                    if (SUB168(auVar4 * auVar7,8) != 0) goto LAB_0011c23a;
                  }
LAB_0011c46a:
                  local_2b0 = uVar30;
                  CVar29 = CURLE_OK;
                  pbVar22 = pbVar23;
                  goto LAB_0011c082;
                }
                pcVar16 = "bad range";
                if (min_c <= max_c) {
                  uVar14 = (int)max_c - (int)min_c;
                  pcVar16 = "bad range";
                  if (((int)uVar14 < 0x1a) && (pcVar16 = "bad range", uVar30 <= uVar14))
                  goto LAB_0011c269;
                }
              }
LAB_0011c23a:
              glob_00->error = pcVar16;
LAB_0011c245:
              glob_00->pos = (size_t)local_2a8;
            }
            CVar29 = CURLE_URL_MALFORMAT;
            pbVar22 = pbVar24;
          }
          else if (*pbVar22 == 0x7b) {
            local_290 = pbVar22 + 1;
            local_278 = (byte *)glob_00->glob_buffer;
            sVar2 = glob_00->size;
            pUVar25 = glob_00->pattern + sVar2;
            glob_00->pattern[sVar2].type = UPTSet;
            paVar31 = &glob_00->pattern[sVar2].content;
            paVar19 = &glob_00->pattern[sVar2].content;
            (paVar19->Set).elements = (char **)0x0;
            ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar19->Set + 8))->min_c = '\0';
            ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar19->Set + 8))->max_c = '\0';
            ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar19->Set + 8))->ptr_c = '\0';
            ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar19->Set + 8))->field_0x3 = 0;
            ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar19->Set + 8))->step = 0;
            glob_00->pattern[sVar2].globindex = local_284;
            local_284 = local_284 + 1;
            local_270 = 1;
            local_250 = local_2a8;
            local_298 = paVar31;
            local_248 = pUVar25;
LAB_0011be19:
            local_280 = local_250 + 1;
            iVar12 = 1;
            lVar27 = local_270;
            do {
              bVar32 = iVar12 == 0;
              iVar12 = iVar12 + -1;
              if (bVar32) {
                pbVar22 = local_290 + local_270;
                local_2a8 = local_280;
                goto LAB_0011bd92;
              }
              bVar11 = pbVar22[lVar27];
              uVar30 = local_2b0;
              if (bVar11 == 0x2c) goto LAB_0011be75;
              if (bVar11 != 0x7d) {
                if ((bVar11 != 0x7b) && (bVar11 != 0x5b)) {
                  if (bVar11 == 0x5c) {
                    bVar11 = pbVar22[lVar27 + 1];
                    if (bVar11 == 0) {
                      bVar11 = 0x5c;
                    }
                    else {
                      lVar27 = lVar27 + 1;
                      local_280 = local_250 + 2;
                    }
                  }
                  else {
                    if (bVar11 == 0x5d) {
                      pcVar16 = "unexpected close bracket";
                      goto LAB_0011c327;
                    }
                    if (bVar11 == 0) {
                      glob_00->error = "unmatched brace";
                      glob_00->pos = (size_t)local_2a8;
                      goto LAB_0011c335;
                    }
                  }
                  *local_278 = bVar11;
                  local_278 = local_278 + 1;
                  goto LAB_0011bf74;
                }
                pcVar16 = "nested brace";
LAB_0011c327:
                glob_00->error = pcVar16;
                glob_00->pos = (size_t)local_280;
LAB_0011c335:
                CVar29 = CURLE_URL_MALFORMAT;
                local_2a8 = local_280;
                pbVar22 = local_290;
                break;
              }
              if (lVar27 == 1) {
                pcVar16 = "empty string within braces";
                goto LAB_0011c327;
              }
              iVar13 = (pUVar25->content).Set.size + 1;
              if (iVar13 != 0) {
                auVar3._8_8_ = 0;
                auVar3._0_8_ = (long)iVar13;
                auVar6._8_8_ = 0;
                auVar6._0_8_ = local_2b0;
                uVar30 = SUB168(auVar3 * auVar6,0);
                if (SUB168(auVar3 * auVar6,8) == 0) goto LAB_0011be75;
                glob_00->error = "range overflow";
                glob_00->pos = 0;
                goto LAB_0011c335;
              }
              local_2b0 = 0;
              uVar30 = local_2b0;
LAB_0011be75:
              local_2b0 = uVar30;
              *local_278 = 0;
              if ((paVar31->Set).elements == (char **)0x0) {
                ppcVar17 = (char **)malloc(8);
                (paVar31->Set).elements = ppcVar17;
                if (ppcVar17 != (char **)0x0) goto LAB_0011bec3;
LAB_0011c0e8:
                glob_00->error = "out of memory";
                glob_00->pos = 0;
                CVar29 = CURLE_OUT_OF_MEMORY;
                local_2a8 = local_280;
                pbVar22 = local_290;
                break;
              }
              ppcVar17 = (char **)realloc((paVar31->Set).elements,
                                          (long)(pUVar25->content).Set.size * 8 + 8);
              if (ppcVar17 == (char **)0x0) goto LAB_0011c0e8;
              (local_298->Set).elements = ppcVar17;
LAB_0011bec3:
              pcVar16 = strdup(glob_00->glob_buffer);
              iVar13 = (local_248->content).Set.size;
              ppcVar17[iVar13] = pcVar16;
              if (pcVar16 == (char *)0x0) goto LAB_0011c0e8;
              (local_248->content).Set.size = iVar13 + 1;
              pUVar25 = local_248;
              paVar31 = local_298;
              if (pbVar22[lVar27] != 0x7d) goto LAB_0011bf35;
              lVar27 = lVar27 + 1;
            } while( true );
          }
        }
        else {
          *pbVar24 = 0;
          pcVar16 = glob_00->glob_buffer;
          sVar2 = glob_00->size;
          glob_00->pattern[sVar2].type = UPTSet;
          glob_00->pattern[sVar2].globindex = -1;
          glob_00->pattern[sVar2].content.NumRange.max_n = 1;
          ppcVar17 = (char **)malloc(8);
          glob_00->pattern[sVar2].content.Set.elements = ppcVar17;
          if (ppcVar17 != (char **)0x0) {
            __dest = (char *)malloc(sVar15 + 1);
            *ppcVar17 = __dest;
            if (__dest != (char *)0x0) {
              memcpy(__dest,pcVar16,sVar15);
              __dest[sVar15] = '\0';
LAB_0011bd92:
              CVar29 = CURLE_OK;
              goto LAB_0011c082;
            }
          }
          glob_00->error = "out of memory";
          glob_00->pos = 0;
          CVar29 = CURLE_OUT_OF_MEMORY;
        }
LAB_0011c082:
        uVar30 = glob_00->size + 1;
        glob_00->size = uVar30;
      } while (uVar30 < 100);
      pcVar16 = "too many globs";
LAB_0011c50c:
      glob_00->error = pcVar16;
      glob_00->pos = (size_t)local_2a8;
      CVar29 = CURLE_URL_MALFORMAT;
LAB_0011c528:
      pFVar9 = local_268;
      if ((local_268 != (FILE *)0x0) &&
         (ppcVar17 = (char **)glob_00->error, ppcVar17 != (char **)0x0)) {
        sVar2 = glob_00->pos;
        if (sVar2 != 0) {
          curl_msnprintf(&endp,0x200,"%s in URL position %zu:\n%s\n%*s^",ppcVar17,sVar2,local_258,
                         sVar2 - 1," ");
          ppcVar17 = &endp;
        }
        curl_mfprintf(pFVar9,"curl: (%d) %s\n",CVar29,ppcVar17);
      }
      glob_cleanup(glob_00);
      *local_260 = 1;
    }
  }
  return CVar29;
LAB_0011bf35:
  local_278 = (byte *)glob_00->glob_buffer;
LAB_0011bf74:
  local_270 = lVar27 + 1;
  local_250 = local_280;
  goto LAB_0011be19;
}

Assistant:

CURLcode glob_url(URLGlob **glob, char *url, unsigned long *urlnum,
                  FILE *error)
{
  /*
   * We can deal with any-size, just make a buffer with the same length
   * as the specified URL!
   */
  URLGlob *glob_expand;
  unsigned long amount = 0;
  char *glob_buffer;
  CURLcode res;

  *glob = NULL;

  glob_buffer = malloc(strlen(url) + 1);
  if(!glob_buffer)
    return CURLE_OUT_OF_MEMORY;
  glob_buffer[0] = 0;

  glob_expand = calloc(1, sizeof(URLGlob));
  if(!glob_expand) {
    Curl_safefree(glob_buffer);
    return CURLE_OUT_OF_MEMORY;
  }
  glob_expand->urllen = strlen(url);
  glob_expand->glob_buffer = glob_buffer;

  res = glob_parse(glob_expand, url, 1, &amount);
  if(!res)
    *urlnum = amount;
  else {
    if(error && glob_expand->error) {
      char text[512];
      const char *t;
      if(glob_expand->pos) {
        msnprintf(text, sizeof(text), "%s in URL position %zu:\n%s\n%*s^",
                  glob_expand->error,
                  glob_expand->pos, url, glob_expand->pos - 1, " ");
        t = text;
      }
      else
        t = glob_expand->error;

      /* send error description to the error-stream */
      fprintf(error, "curl: (%d) %s\n", res, t);
    }
    /* it failed, we cleanup */
    glob_cleanup(glob_expand);
    *urlnum = 1;
    return res;
  }

  *glob = glob_expand;
  return CURLE_OK;
}